

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::LexFloat(AsciiParser *this,string *result)

{
  int *piVar1;
  StreamReader *pSVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  ostream *poVar6;
  ulong uVar7;
  char *pcVar8;
  char curr;
  string local_348;
  char c;
  stringstream ss;
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  bVar3 = Char1(this,&curr);
  if (bVar3) {
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    if ((curr == '-') || (curr == '+')) {
      ::std::operator<<(local_1a0,curr);
      bVar3 = Char1(this,&c);
      if (bVar3) {
        if (c != '.') {
          pSVar2 = this->_sr;
          if ((0 < (long)pSVar2->idx_) && (uVar7 = pSVar2->idx_ - 1, uVar7 <= pSVar2->length_)) {
            pSVar2->idx_ = uVar7;
          }
          goto LAB_002de7b6;
        }
        piVar1 = &(this->_curr_cursor).col;
        *piVar1 = *piVar1 + 1;
        ::std::operator<<(local_1a0,'.');
        goto LAB_002de814;
      }
    }
    else {
      if (0xf5 < (byte)(curr - 0x3aU)) {
        ::std::operator<<(local_1a0,curr);
LAB_002de7b6:
        while (bVar3 = Eof(this), !bVar3) {
          bVar3 = Char1(this,&curr);
          if (!bVar3) goto LAB_002de97d;
          if (9 < (byte)(curr - 0x30U)) {
            pSVar2 = this->_sr;
            if ((0 < (long)pSVar2->idx_) && (uVar7 = pSVar2->idx_ - 1, uVar7 <= pSVar2->length_)) {
              pSVar2->idx_ = uVar7;
            }
            break;
          }
          ::std::operator<<(local_1a0,curr);
        }
LAB_002de814:
        bVar3 = Eof(this);
        if (!bVar3) {
          bVar3 = Char1(this,&curr);
          if (!bVar3) goto LAB_002de97d;
          if (curr == '.') {
            cVar4 = '.';
            do {
              ::std::operator<<(local_1a0,cVar4);
              bVar3 = Eof(this);
              if (bVar3) break;
              bVar3 = Char1(this,&curr);
              if (!bVar3) goto LAB_002de97d;
              cVar4 = curr;
            } while ((byte)(curr - 0x30U) < 10);
          }
          else if ((curr & 0xdfU) != 0x45) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)result,(string *)&c);
            ::std::__cxx11::string::_M_dispose();
            pSVar2 = this->_sr;
            bVar3 = true;
            if ((0 < (long)pSVar2->idx_) && (uVar7 = pSVar2->idx_ - 1, uVar7 <= pSVar2->length_)) {
              pSVar2->idx_ = uVar7;
            }
            goto LAB_002de97f;
          }
          bVar3 = Eof(this);
          if (!bVar3) {
            if ((curr & 0xdfU) == 0x45) {
              ::std::operator<<(local_1a0,curr);
              bVar3 = Char1(this,&curr);
              if (bVar3) {
                bVar3 = true;
                if ((curr != '-') && (curr != '+')) {
                  if (9 < (byte)(curr - 0x30U)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
                    poVar6 = ::std::operator<<((ostream *)&c,"[error]");
                    poVar6 = ::std::operator<<(poVar6,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                              );
                    poVar6 = ::std::operator<<(poVar6,":");
                    poVar6 = ::std::operator<<(poVar6,"LexFloat");
                    poVar6 = ::std::operator<<(poVar6,"():");
                    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xb8a);
                    ::std::operator<<(poVar6," ");
                    pcVar8 = "Empty `E\' is not allowed.";
                    goto LAB_002de939;
                  }
                  bVar3 = false;
                }
                do {
                  do {
                    ::std::operator<<(local_1a0,curr);
                    bVar5 = Eof(this);
                    if (bVar5) goto LAB_002de820;
                    bVar5 = Char1(this,&curr);
                    if (!bVar5) goto LAB_002de97d;
                  } while ((byte)(curr - 0x30U) < 10);
                  if ((curr != '-') && (curr != '+')) goto LAB_002deb37;
                  bVar5 = !bVar3;
                  bVar3 = true;
                } while (bVar5);
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
                poVar6 = ::std::operator<<((ostream *)&c,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"LexFloat");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xb99);
                ::std::operator<<(poVar6," ");
                pcVar8 = "No multiple exponential sign characters.";
                goto LAB_002de939;
              }
              goto LAB_002de97d;
            }
LAB_002deb37:
            pSVar2 = this->_sr;
            if ((0 < (long)pSVar2->idx_) && (uVar7 = pSVar2->idx_ - 1, uVar7 <= pSVar2->length_)) {
              pSVar2->idx_ = uVar7;
            }
          }
        }
LAB_002de820:
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::operator=((string *)result,(string *)&c);
        ::std::__cxx11::string::_M_dispose();
        bVar3 = true;
        goto LAB_002de97f;
      }
      if (curr == '.') {
        bVar3 = Rewind(this,1);
        if (bVar3) {
          piVar1 = &(this->_curr_cursor).col;
          *piVar1 = *piVar1 + -1;
          goto LAB_002de814;
        }
        goto LAB_002de97d;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&c);
      poVar6 = ::std::operator<<((ostream *)&c,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"LexFloat");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0xb32);
      ::std::operator<<(poVar6," ");
      pcVar8 = "Sign or `.` or 0-9 expected.";
LAB_002de939:
      poVar6 = ::std::operator<<((ostream *)&c,pcVar8);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_348);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&c);
    }
  }
LAB_002de97d:
  bVar3 = false;
LAB_002de97f:
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return bVar3;
}

Assistant:

bool AsciiParser::LexFloat(std::string *result) {
  // FLOATVAL : ('+' or '-')? FLOAT
  // FLOAT
  //     :   ('0'..'9')+ '.' ('0'..'9')* EXPONENT?
  //     |   '.' ('0'..'9')+ EXPONENT?
  //     |   ('0'..'9')+ EXPONENT
  //     ;
  // EXPONENT : ('e'|'E') ('+'|'-')? ('0'..'9')+ ;

  std::stringstream ss;

  bool has_sign{false};
  bool leading_decimal_dots{false};
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign, '.' or [0-9]
    if ((sc == '+') || (sc == '-')) {
      ss << sc;
      has_sign = true;

      char c;
      if (!Char1(&c)) {
        return false;
      }

      if (c == '.') {
        // ok. something like `+.7`, `-.53`
        leading_decimal_dots = true;
        _curr_cursor.col++;
        ss << c;

      } else {
        // unwind and continue
        _sr->seek_from_current(-1);
      }

    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
      ss << sc;
    } else if (sc == '.') {
      // ok but rescan again in 2.
      leading_decimal_dots = true;
      if (!Rewind(1)) {
        return false;
      }
      _curr_cursor.col--;
    } else {
      PUSH_ERROR_AND_RETURN("Sign or `.` or 0-9 expected.");
    }
  }

  (void)has_sign;

  // 1. Read the integer part
  char curr;
  if (!leading_decimal_dots) {
    // std::cout << "1 read int part: ss = " << ss.str() << "\n";

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      // std::cout << "1 curr = " << curr << "\n";
      if ((curr >= '0') && (curr <= '9')) {
        // continue
        ss << curr;
      } else {
        _sr->seek_from_current(-1);
        break;
      }
    }
  }

  if (Eof()) {
    (*result) = ss.str();
    return true;
  }

  if (!Char1(&curr)) {
    return false;
  }

  // std::cout << "before 2: ss = " << ss.str() << ", curr = " << curr <<
  // "\n";

  // 2. Read the decimal part
  if (curr == '.') {
    ss << curr;

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      if ((curr >= '0') && (curr <= '9')) {
        ss << curr;
      } else {
        break;
      }
    }

  } else if ((curr == 'e') || (curr == 'E')) {
    // go to 3.
  } else {
    // end
    (*result) = ss.str();
    _sr->seek_from_current(-1);
    return true;
  }

  if (Eof()) {
    (*result) = ss.str();
    return true;
  }

  // 3. Read the exponent part
  bool has_exp_sign{false};
  if ((curr == 'e') || (curr == 'E')) {
    ss << curr;

    if (!Char1(&curr)) {
      return false;
    }

    if ((curr == '+') || (curr == '-')) {
      // exp sign
      ss << curr;
      has_exp_sign = true;

    } else if ((curr >= '0') && (curr <= '9')) {
      // ok
      ss << curr;
    } else {
      // Empty E is not allowed.
      PUSH_ERROR_AND_RETURN("Empty `E' is not allowed.");
    }

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      if ((curr >= '0') && (curr <= '9')) {
        // ok
        ss << curr;

      } else if ((curr == '+') || (curr == '-')) {
        if (has_exp_sign) {
          // No multiple sign characters
          PUSH_ERROR_AND_RETURN("No multiple exponential sign characters.");
        }

        ss << curr;
        has_exp_sign = true;
      } else {
        // end
        _sr->seek_from_current(-1);
        break;
      }
    }
  } else {
    _sr->seek_from_current(-1);
  }

  (*result) = ss.str();
  return true;
}